

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cc
# Opt level: O2

void __thiscall tt::net::Epoll::epoll_add(Epoll *this,SP_Channel *request,int timeout)

{
  element_type *peVar1;
  int __fd;
  int iVar2;
  __shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2> local_50;
  undefined1 local_40 [8];
  epoll_event event;
  
  __fd = Channel::getFd((request->super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr);
  if (0 < timeout) {
    std::__shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,&request->super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>)
    ;
    add_timer(this,(SP_Channel *)&local_50,timeout);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__shared_ptr<tt::net::HttpData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<tt::net::HttpData,_(__gnu_cxx::_Lock_policy)2> *)local_40,
               &((request->super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                ->m_holder);
    std::__shared_ptr<tt::net::HttpData,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&this->m_fd2http[__fd].
                super___shared_ptr<tt::net::HttpData,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<tt::net::HttpData,_(__gnu_cxx::_Lock_policy)2> *)local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&event);
  }
  peVar1 = (request->super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_40._0_4_ = peVar1->m_events;
  peVar1->m_lastEvents = local_40._0_4_;
  local_40._4_4_ = __fd;
  std::__shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this->m_fd2chan[__fd].super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>
             ,&request->super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>);
  iVar2 = epoll_ctl(this->m_epollFd,1,__fd,(epoll_event *)local_40);
  if (iVar2 < 0) {
    perror("epoll_add error");
    std::__shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>::reset
              (&this->m_fd2chan[__fd].
                super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>);
  }
  return;
}

Assistant:

void Epoll::epoll_add(SP_Channel request, int timeout){
	
	int fd = request->getFd();

	if(timeout > 0){
		add_timer(request, timeout);
		m_fd2http[fd] = request->getHolder();
	}


	struct epoll_event event;
	
	event.data.fd = fd;
	event.events  =request->getEvents();
	
	request->EqualAndUpdateLastEvents();
	m_fd2chan[fd] = request;

	if(epoll_ctl(m_epollFd, EPOLL_CTL_ADD, fd, &event) < 0){
		perror("epoll_add error");
		m_fd2chan[fd].reset();
	}

}